

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acmod.c
# Opt level: O2

int acmod_start_utt(acmod_t *acmod)

{
  fe_start_utt(acmod->fe);
  acmod->state = '\x01';
  acmod->n_mfc_frame = 0;
  acmod->mfc_outidx = 0;
  acmod->n_feat_frame = 0;
  acmod->feat_outidx = 0;
  acmod->output_frame = 0;
  acmod->senscr_frame = -1;
  acmod->n_senone_active = 0;
  acmod->mgau->frame_idx = 0;
  return 0;
}

Assistant:

int
acmod_start_utt(acmod_t *acmod)
{
    fe_start_utt(acmod->fe);
    acmod->state = ACMOD_STARTED;
    acmod->n_mfc_frame = 0;
    acmod->n_feat_frame = 0;
    acmod->mfc_outidx = 0;
    acmod->feat_outidx = 0;
    acmod->output_frame = 0;
    acmod->senscr_frame = -1;
    acmod->n_senone_active = 0;
    acmod->mgau->frame_idx = 0;
    return 0;
}